

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O3

void __thiscall
duckdb::TopNHeap::Sink
          (TopNHeap *this,DataChunk *input,
          optional_ptr<duckdb::TopNBoundaryValue,_true> global_boundary)

{
  DataChunk *this_00;
  bool bVar1;
  reference result;
  optional_ptr<duckdb::TopNBoundaryValue,_true> local_28;
  
  this_00 = &this->sort_chunk;
  local_28.ptr = global_boundary.ptr;
  DataChunk::Reset(this_00);
  ExpressionExecutor::Execute(&this->executor,input,this_00);
  if (global_boundary.ptr != (TopNBoundaryValue *)0x0) {
    optional_ptr<duckdb::TopNBoundaryValue,_true>::CheckValid(&local_28);
    bVar1 = CheckBoundaryValues(this,this_00,input,local_28.ptr);
    if (!bVar1) {
      return;
    }
  }
  DataChunk::Reset(&this->sort_keys);
  result = vector<duckdb::Vector,_true>::operator[](&(this->sort_keys).data,0);
  CreateSortKeyHelpers::CreateSortKey(this_00,&this->modifiers,result);
  if (this->heap_size < 0x65) {
    AddSmallHeap(this,input,result);
  }
  else {
    AddLargeHeap(this,input,result);
  }
  if ((this->heap_size <=
       (ulong)(((long)(this->heap).
                      super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                      super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->heap).
                      super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                      super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) &&
     (local_28.ptr != (TopNBoundaryValue *)0x0)) {
    optional_ptr<duckdb::TopNBoundaryValue,_true>::CheckValid(&local_28);
    TopNBoundaryValue::UpdateValue
              (local_28.ptr,
               (string_t)
               ((anon_union_16_2_67f50693_for_value *)
               (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
               super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
               super__Vector_impl_data._M_start)->pointer);
  }
  return;
}

Assistant:

void TopNHeap::Sink(DataChunk &input, optional_ptr<TopNBoundaryValue> global_boundary) {
	static constexpr idx_t SMALL_HEAP_THRESHOLD = 100;

	// compute the ordering values for the new chunk
	sort_chunk.Reset();
	executor.Execute(input, sort_chunk);

	if (global_boundary) {
		// if we have a global boundary value check which rows pass before doing anything
		if (!CheckBoundaryValues(sort_chunk, input, *global_boundary)) {
			// nothing in this chunk can be in the final result
			return;
		}
	}

	// construct the sort key from the sort chunk
	sort_keys.Reset();
	auto &sort_keys_vec = sort_keys.data[0];
	CreateSortKeyHelpers::CreateSortKey(sort_chunk, modifiers, sort_keys_vec);

	if (heap_size <= SMALL_HEAP_THRESHOLD) {
		AddSmallHeap(input, sort_keys_vec);
	} else {
		AddLargeHeap(input, sort_keys_vec);
	}

	// if we modified the heap we might be able to update the global boundary
	// note that the global boundary only applies to FULL heaps
	if (heap.size() >= heap_size && global_boundary) {
		global_boundary->UpdateValue(heap.front().sort_key);
	}
}